

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_filter.cpp
# Opt level: O0

void __thiscall cppcms::copy_filter::copy_filter(copy_filter *this,ostream *output)

{
  streambuf *psVar1;
  noncopyable *pnVar2;
  long *in_RSI;
  noncopyable *in_RDI;
  unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_> device;
  unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_>
  *in_stack_ffffffffffffff78;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_> *this_00;
  ostream *in_stack_ffffffffffffff88;
  tee_device *in_stack_ffffffffffffff90;
  undefined1 *puVar3;
  undefined1 local_30 [8];
  unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_> local_28 [3];
  long *local_10;
  
  local_10 = in_RSI;
  booster::noncopyable::noncopyable(in_RDI);
  booster::hold_ptr<cppcms::copy_filter::data>::hold_ptr
            ((hold_ptr<cppcms::copy_filter::data> *)in_RDI);
  booster::streambuf::streambuf((streambuf *)(in_RDI + 8));
  *(long **)(in_RDI + 0x98) = local_10;
  psVar1 = (streambuf *)
           std::ios::rdbuf((streambuf *)((long)local_10 + *(long *)(*local_10 + -0x18)));
  std::ostream::ostream(in_RDI + 0xa0,psVar1);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x46fa04);
  in_RDI[0x1c8] = (noncopyable)0x0;
  operator_new(0x18);
  tee_device::tee_device
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  this_00 = local_28;
  std::unique_ptr<booster::io_device,std::default_delete<booster::io_device>>::
  unique_ptr<std::default_delete<booster::io_device>,void>
            (this_00,(pointer)in_stack_ffffffffffffff78);
  pnVar2 = in_RDI + 8;
  puVar3 = local_30;
  std::unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_>::unique_ptr
            (this_00,in_stack_ffffffffffffff78);
  booster::streambuf::device(pnVar2,puVar3);
  std::unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_>::~unique_ptr
            (this_00);
  std::unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_>::~unique_ptr
            (this_00);
  return;
}

Assistant:

copy_filter::copy_filter(std::ostream &output) :
		output_(output),
		real_output_stream_(output.rdbuf(&copy_buffer_)),
		detached_(false)
	{
		std::unique_ptr<booster::io_device> device(new tee_device(real_output_stream_,data_));
		copy_buffer_.device(std::move(device));
	}